

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall slang::SmallVector<int,_10UL>::SmallVector(SmallVector<int,_10UL> *this,Base *other)

{
  move_iterator<int_*> first;
  size_type sVar1;
  
  (this->super_SmallVectorBase<int>).data_ =
       (pointer)(this->super_SmallVectorBase<int>).firstElement;
  (this->super_SmallVectorBase<int>).len = 0;
  (this->super_SmallVectorBase<int>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current == (int *)other->firstElement) {
    (this->super_SmallVectorBase<int>).cap = 10;
    SmallVectorBase<int>::append<std::move_iterator<int_*>_>
              (&this->super_SmallVectorBase<int>,first,
               (move_iterator<int_*>)(first._M_current + other->len));
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<int>).data_ = first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<int>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<int>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }